

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslkey_p.cpp
# Opt level: O2

QDebug operator<<(QDebug debug,QSslKey *key)

{
  long lVar1;
  QSslKeyPrivate *pQVar2;
  KeyType KVar3;
  KeyAlgorithm KVar4;
  int t;
  long *plVar5;
  QDebug *pQVar6;
  QSslKey *in_RDX;
  char *pcVar7;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _saver = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)key);
  plVar5 = (long *)QDebug::resetFormat();
  *(undefined1 *)(*plVar5 + 0x30) = 0;
  pQVar6 = QDebug::operator<<((QDebug *)key,"QSslKey(");
  KVar3 = QSslKey::type(in_RDX);
  pcVar7 = "PrivateKey";
  if (KVar3 == PublicKey) {
    pcVar7 = "PublicKey";
  }
  pQVar6 = QDebug::operator<<(pQVar6,pcVar7);
  pQVar6 = QDebug::operator<<(pQVar6,", ");
  KVar4 = QSslKey::algorithm(in_RDX);
  if (KVar4 == Opaque) {
    pcVar7 = "OPAQUE";
  }
  else {
    KVar4 = QSslKey::algorithm(in_RDX);
    if (KVar4 == Rsa) {
      pcVar7 = "RSA";
    }
    else {
      KVar4 = QSslKey::algorithm(in_RDX);
      if (KVar4 == Dsa) {
        pcVar7 = "DSA";
      }
      else {
        KVar4 = QSslKey::algorithm(in_RDX);
        pcVar7 = "EC";
        if (KVar4 == Dh) {
          pcVar7 = "DH";
        }
      }
    }
  }
  pQVar6 = QDebug::operator<<(pQVar6,pcVar7);
  pQVar6 = QDebug::operator<<(pQVar6,", ");
  t = QSslKey::length(in_RDX);
  pQVar6 = QDebug::operator<<(pQVar6,t);
  QDebug::operator<<(pQVar6,')');
  pQVar2 = (key->d).d.ptr;
  (key->d).d.ptr = (QSslKeyPrivate *)0x0;
  *(QSslKeyPrivate **)debug.stream = pQVar2;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, const QSslKey &key)
{
    QDebugStateSaver saver(debug);
    debug.resetFormat().nospace();
    debug << "QSslKey("
          << (key.type() == QSsl::PublicKey ? "PublicKey" : "PrivateKey")
          << ", " << (key.algorithm() == QSsl::Opaque ? "OPAQUE" :
                     (key.algorithm() == QSsl::Rsa ? "RSA" :
                     (key.algorithm() == QSsl::Dsa ? "DSA" :
                     (key.algorithm() == QSsl::Dh ? "DH" : "EC"))))
          << ", " << key.length()
          << ')';
    return debug;
}